

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeValves(ProjectWriter *this)

{
  undefined1 *puVar1;
  double dVar2;
  pointer ppLVar3;
  Link *pLVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ostream *poVar8;
  Curve *pCVar9;
  Valve *valve;
  pointer ppLVar10;
  double extraout_XMM0_Qa;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[VALVES]\n");
  ppLVar3 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar10 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl
                  .super__Vector_impl_data._M_start; ppLVar10 != ppLVar3; ppLVar10 = ppLVar10 + 1) {
    pLVar4 = *ppLVar10;
    iVar7 = (*(pLVar4->super_Element)._vptr_Element[2])(pLVar4);
    if (iVar7 == 2) {
      lVar5 = *(long *)&this->field_0x18;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(&this->field_0x30 + lVar6) =
           *(uint *)(&this->field_0x30 + lVar6) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0x10;
      poVar8 = std::operator<<((ostream *)puVar1,(string *)&(pLVar4->super_Element).name);
      std::operator<<(poVar8," ");
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::operator<<((ostream *)puVar1,(string *)&(pLVar4->fromNode->super_Element).name);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::operator<<((ostream *)puVar1,(string *)&(pLVar4->toNode->super_Element).name);
      lVar5 = *(long *)&this->field_0x18;
      *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>(pLVar4->diameter * (this->network->units).factors[0]);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
      std::operator<<((ostream *)puVar1,
                      Valve::ValveTypeWords[*(int *)&pLVar4[1].super_Element._vptr_Element]);
      if (*(int *)&pLVar4[1].super_Element._vptr_Element == 5) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        pCVar9 = Network::curve(this->network,(int)pLVar4->initSetting);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)&(pCVar9->super_Element).name);
      }
      else {
        dVar2 = pLVar4->initSetting;
        (*(pLVar4->super_Element)._vptr_Element[5])(pLVar4,this->network);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        poVar8 = std::ostream::_M_insert<double>((dVar2 / extraout_XMM0_Qa) * pLVar4->initSetting);
      }
      std::operator<<(poVar8,"\n");
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeValves()
{
    fout << "\n[VALVES]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::VALVE )
        {
            Valve* valve = static_cast<Valve*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);
            fout << setw(12) << valve->diameter*network->ucf(Units::DIAMETER);
            fout << setw(8) << Valve::ValveTypeWords[(int)valve->valveType];

            if (valve->valveType == Valve::GPV)
            {
                fout << setw(16) << network->curve((int)link->initSetting)->name << "\n";
            }
            else
            {
                double cf = link->initSetting /
                            link->convertSetting(network, link->initSetting);
                fout << setw(12) << cf * link->initSetting << "\n";
            }
        }
    }
}